

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O2

void yprp_typedef(lys_ypr_ctx_conflict *pctx,lysp_tpdf *tpdf)

{
  uint16_t *puVar1;
  char *text;
  
  ypr_open(pctx,"typedef","name",tpdf->name,'\x01');
  puVar1 = &(pctx->field_0).field_0.level;
  *puVar1 = *puVar1 + 1;
  yprp_extension_instances(pctx,LY_STMT_TYPEDEF,'\0',tpdf->exts,(int8_t *)0x0);
  yprp_type(pctx,&tpdf->type);
  if (tpdf->units != (char *)0x0) {
    ypr_substmt(pctx,LY_STMT_UNITS,'\0',tpdf->units,tpdf->exts);
  }
  text = (tpdf->dflt).str;
  if (text != (char *)0x0) {
    ypr_substmt(pctx,LY_STMT_DEFAULT,'\0',text,tpdf->exts);
  }
  ypr_status(pctx,tpdf->flags,tpdf->exts,(int8_t *)0x0);
  ypr_description(pctx,tpdf->dsc,tpdf->exts,(int8_t *)0x0);
  ypr_reference(pctx,tpdf->ref,tpdf->exts,(int8_t *)0x0);
  puVar1 = &(pctx->field_0).field_0.level;
  *puVar1 = *puVar1 - 1;
  ypr_close(pctx,"typedef",'\x01');
  return;
}

Assistant:

static void
yprp_typedef(struct lys_ypr_ctx *pctx, const struct lysp_tpdf *tpdf)
{
    ypr_open(pctx, "typedef", "name", tpdf->name, 1);
    LEVEL++;

    yprp_extension_instances(pctx, LY_STMT_TYPEDEF, 0, tpdf->exts, NULL);

    yprp_type(pctx, &tpdf->type);

    if (tpdf->units) {
        ypr_substmt(pctx, LY_STMT_UNITS, 0, tpdf->units, tpdf->exts);
    }
    if (tpdf->dflt.str) {
        ypr_substmt(pctx, LY_STMT_DEFAULT, 0, tpdf->dflt.str, tpdf->exts);
    }

    ypr_status(pctx, tpdf->flags, tpdf->exts, NULL);
    ypr_description(pctx, tpdf->dsc, tpdf->exts, NULL);
    ypr_reference(pctx, tpdf->ref, tpdf->exts, NULL);

    LEVEL--;
    ypr_close(pctx, "typedef", 1);
}